

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

DefaultValueObjectWriter * __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::EndList(DefaultValueObjectWriter *this)

{
  _Elt_pointer ppNVar1;
  
  ppNVar1 = (this->stack_).c.
            super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppNVar1 ==
      (this->stack_).c.
      super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    WriteRoot(this);
  }
  else {
    if (ppNVar1 ==
        (this->stack_).c.
        super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppNVar1 = (this->stack_).c.
                super__Deque_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->current_ = ppNVar1[-1];
    std::
    deque<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
    ::pop_back(&(this->stack_).c);
  }
  return this;
}

Assistant:

DefaultValueObjectWriter* DefaultValueObjectWriter::EndList() {
  if (stack_.empty()) {
    WriteRoot();
    return this;
  }
  current_ = stack_.top();
  stack_.pop();
  return this;
}